

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O0

int Bac_ManAddBarbuf(Gia_Man_t *pNew,int iRes,Bac_Man_t *p,int iLNtk,int iLObj,int iRNtk,int iRObj,
                    Vec_Int_t *vMap)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int c;
  int iIdLit;
  int iBufLit;
  int iRNtk_local;
  int iLObj_local;
  int iLNtk_local;
  Bac_Man_t *p_local;
  int iRes_local;
  Gia_Man_t *pNew_local;
  
  pNew_local._4_4_ = iRes;
  if ((iRes != 0) && (iRes != 1)) {
    if (iRes < 1) {
      __assert_fail("iRes > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacBlast.c"
                    ,0x5c,
                    "int Bac_ManAddBarbuf(Gia_Man_t *, int, Bac_Man_t *, int, int, int, int, Vec_Int_t *)"
                   );
    }
    if (vMap != (Vec_Int_t *)0x0) {
      iVar1 = Abc_Lit2Var(iRes);
      iVar2 = Vec_IntSize(vMap);
      if (iVar1 < iVar2) {
        iVar1 = Abc_Lit2Var(iRes);
        iVar1 = Vec_IntEntry(vMap,iVar1);
        if (-1 < iVar1) {
          iVar2 = Abc_Lit2Var(iVar1);
          iVar2 = Vec_IntEntry(&p->vBuf2LeafNtk,iVar2);
          if (iVar2 == iLNtk) {
            iVar2 = Abc_Lit2Var(iVar1);
            iVar2 = Vec_IntEntry(&p->vBuf2RootNtk,iVar2);
            if (iVar2 == iRNtk) {
              p_00 = pNew->vBarBufs;
              iVar2 = Abc_Lit2Var(iVar1);
              iVar2 = Vec_IntEntry(p_00,iVar2);
              uVar3 = Abc_LitIsCompl(iRes);
              uVar4 = Abc_LitIsCompl(iVar1);
              iVar1 = Abc_LitNotCond(iVar2,uVar3 ^ uVar4);
              return iVar1;
            }
          }
        }
      }
    }
    iVar1 = Bac_ManNtkIsOk(p,iLNtk);
    if ((iVar1 == 0) || (iVar1 = Bac_ManNtkIsOk(p,iRNtk), iVar1 == 0)) {
      __assert_fail("Bac_ManNtkIsOk(p, iLNtk) && Bac_ManNtkIsOk(p, iRNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacBlast.c"
                    ,0x60,
                    "int Bac_ManAddBarbuf(Gia_Man_t *, int, Bac_Man_t *, int, int, int, int, Vec_Int_t *)"
                   );
    }
    Vec_IntPush(&p->vBuf2LeafNtk,iLNtk);
    Vec_IntPush(&p->vBuf2LeafObj,iLObj);
    Vec_IntPush(&p->vBuf2RootNtk,iRNtk);
    Vec_IntPush(&p->vBuf2RootObj,iRObj);
    pNew_local._4_4_ = Gia_ManAppendBuf(pNew,iRes);
    if (vMap != (Vec_Int_t *)0x0) {
      iVar1 = Abc_Lit2Var(iRes);
      iVar2 = Vec_IntSize(pNew->vBarBufs);
      c = Abc_LitIsCompl(iRes);
      iVar2 = Abc_Var2Lit(iVar2,c);
      Vec_IntSetEntryFull(vMap,iVar1,iVar2);
      Vec_IntPush(pNew->vBarBufs,pNew_local._4_4_);
    }
  }
  return pNew_local._4_4_;
}

Assistant:

int Bac_ManAddBarbuf( Gia_Man_t * pNew, int iRes, Bac_Man_t * p, int iLNtk, int iLObj, int iRNtk, int iRObj, Vec_Int_t * vMap )
{
    int iBufLit, iIdLit;
    if ( iRes == 0 || iRes == 1 )
        return iRes;
    assert( iRes > 0 );
    if ( vMap && Abc_Lit2Var(iRes) < Vec_IntSize(vMap) && (iIdLit = Vec_IntEntry(vMap, Abc_Lit2Var(iRes))) >= 0 && 
        Vec_IntEntry(&p->vBuf2LeafNtk, Abc_Lit2Var(iIdLit)) == iLNtk && Vec_IntEntry(&p->vBuf2RootNtk, Abc_Lit2Var(iIdLit)) == iRNtk )
        return Abc_LitNotCond( Vec_IntEntry(pNew->vBarBufs, Abc_Lit2Var(iIdLit)), Abc_LitIsCompl(iRes) ^ Abc_LitIsCompl(iIdLit) );
    assert( Bac_ManNtkIsOk(p, iLNtk) && Bac_ManNtkIsOk(p, iRNtk) );
    Vec_IntPush( &p->vBuf2LeafNtk, iLNtk );
    Vec_IntPush( &p->vBuf2LeafObj, iLObj );
    Vec_IntPush( &p->vBuf2RootNtk, iRNtk );
    Vec_IntPush( &p->vBuf2RootObj, iRObj );
    iBufLit = Gia_ManAppendBuf( pNew, iRes );
    if ( vMap )
    {
        Vec_IntSetEntryFull( vMap, Abc_Lit2Var(iRes), Abc_Var2Lit(Vec_IntSize(pNew->vBarBufs), Abc_LitIsCompl(iRes)) );
        Vec_IntPush( pNew->vBarBufs, iBufLit );
    }
    return iBufLit;
}